

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

int __thiscall dnet::data_types::tensor<int,_3U>::init(tensor<int,_3U> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  int local_24;
  uint local_20;
  int i_1;
  index_type fact;
  index_type i;
  array<unsigned_int,_3UL> *sizes_local;
  tensor<int,_3U> *this_local;
  
  i_1 = 0;
  while( true ) {
    sVar1 = std::array<unsigned_int,_3UL>::size(&this->_axes_sort);
    if (sVar1 <= (uint)i_1) break;
    pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->_axes_sort,(ulong)(uint)i_1);
    *pvVar2 = i_1;
    i_1 = i_1 + 1;
  }
  local_20 = 1;
  for (local_24 = 2; -1 < local_24; local_24 = local_24 + -1) {
    pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->_facts,(long)local_24);
    *pvVar2 = local_20;
    pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)ctx,(long)local_24);
    local_20 = *pvVar3 * local_20;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->_data,(ulong)local_20);
  return extraout_EAX;
}

Assistant:

void tensor<T, N>::init(const std::array<index_type, N> &sizes)
        {
            for (index_type i = 0; i < this->_axes_sort.size(); i++) {
                _axes_sort[i] = i;
            }
            index_type fact = 1;
            for (int i = N - 1; i >= 0; i--) {
                this->_facts[i] = fact;
                fact *= sizes[i];
            }
            this->_data.resize(fact);
        }